

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoncentralRelativeAdapter.cpp
# Opt level: O0

void __thiscall
opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter
          (NoncentralRelativeAdapter *this,bearingVectors_t *bearingVectors1,
          bearingVectors_t *bearingVectors2,camCorrespondences_t *camCorrespondences1,
          camCorrespondences_t *camCorrespondences2,translations_t *camOffsets,
          rotations_t *camRotations,rotation_t *R12)

{
  undefined8 in_RCX;
  rotation_t *in_RDX;
  RelativeAdapterBase *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  RelativeAdapterBase::RelativeAdapterBase(in_RSI,in_RDX);
  *in_RDI = &PTR__NoncentralRelativeAdapter_01441b00;
  in_RDI[0xd] = in_RSI;
  in_RDI[0xe] = in_RDX;
  in_RDI[0xf] = in_RCX;
  in_RDI[0x10] = in_R8;
  in_RDI[0x11] = in_R9;
  in_RDI[0x12] = camOffsets;
  return;
}

Assistant:

opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2,
    const camCorrespondences_t & camCorrespondences1,
    const camCorrespondences_t & camCorrespondences2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    const rotation_t & R12 ) :
    RelativeAdapterBase(R12),
    _bearingVectors1(bearingVectors1),
    _bearingVectors2(bearingVectors2),
    _camCorrespondences1(camCorrespondences1),
    _camCorrespondences2(camCorrespondences2),
    _camOffsets(camOffsets),
    _camRotations(camRotations)
{}